

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  string *psVar4;
  cmLocalGenerator *this_00;
  cmake *this_01;
  reference pbVar5;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  undefined1 local_200 [16];
  string local_1f0;
  undefined1 local_1d0 [8];
  cmake *cm;
  string *li;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream e;
  allocator<char> local_19;
  cmTargetSelectLinker *local_18;
  cmTargetSelectLinker *this_local;
  
  local_18 = this;
  this_local = (cmTargetSelectLinker *)__return_storage_ptr__;
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Preferred);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Preferred);
    if (1 < sVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
      poVar3 = std::operator<<((ostream *)&__range2,"Target ");
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               " contains multiple languages with the highest linker preference");
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Preference);
      std::operator<<(poVar3,"):\n");
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->Preferred);
      li = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Preferred);
      while( true ) {
        bVar1 = std::operator!=(&__end2,(_Self *)&li);
        if (!bVar1) break;
        cm = (cmake *)std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2);
        poVar3 = std::operator<<((ostream *)&__range2,"  ");
        poVar3 = std::operator<<(poVar3,(string *)cm);
        std::operator<<(poVar3,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      std::operator<<((ostream *)&__range2,"Set the LINKER_LANGUAGE property for this target.");
      this_00 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      this_01 = cmLocalGenerator::GetCMakeInstance(this_00);
      local_1d0 = (undefined1  [8])this_01;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_200);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_200 + 0x10),
                          (cmListFileBacktrace *)local_200);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_200);
      std::__cxx11::string::~string((string *)(local_200 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
    }
    local_208._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Preferred);
    pbVar5 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_208);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
  {
    if (this->Preferred.empty()) {
      return "";
    }
    if (this->Preferred.size() > 1) {
      std::ostringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for (std::string const& li : this->Preferred) {
        e << "  " << li << "\n";
      }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
    }
    return *this->Preferred.begin();
  }